

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qapplication.cpp
# Opt level: O2

void __thiscall QApplicationPrivate::initializeWidgetFontHash(QApplicationPrivate *this)

{
  long *plVar1;
  QHash<QByteArray,QFont> *this_00;
  QFont *pQVar2;
  long in_FS_OFFSET;
  QArrayDataPointer<char> local_58;
  QArrayDataPointer<char> local_40;
  long local_28;
  
  plVar1 = QGuiApplicationPrivate::platform_theme;
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (QGuiApplicationPrivate::platform_theme != (long *)0x0) {
    this_00 = (QHash<QByteArray,QFont> *)
              QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_app_fonts>_>::
              operator()((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_app_fonts>_>
                          *)this);
    QHash<QByteArray,_QFont>::clear((QHash<QByteArray,_QFont> *)this_00);
    pQVar2 = (QFont *)(**(code **)(*plVar1 + 0x58))(plVar1,1);
    if (pQVar2 != (QFont *)0x0) {
      local_40.d = (Data *)0x0;
      local_58.d = (Data *)0x0;
      local_58.ptr = (char *)0x0;
      local_40.ptr = "QMenu";
      local_58.size = 0;
      local_40.size = 5;
      QHash<QByteArray,QFont>::emplace<QFont_const&>(this_00,(QByteArray *)&local_40,pQVar2);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_40);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_58);
    }
    pQVar2 = (QFont *)(**(code **)(*plVar1 + 0x58))(plVar1,2);
    if (pQVar2 != (QFont *)0x0) {
      local_40.d = (Data *)0x0;
      local_58.d = (Data *)0x0;
      local_58.ptr = (char *)0x0;
      local_40.ptr = "QMenuBar";
      local_58.size = 0;
      local_40.size = 8;
      QHash<QByteArray,QFont>::emplace<QFont_const&>(this_00,(QByteArray *)&local_40,pQVar2);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_40);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_58);
    }
    pQVar2 = (QFont *)(**(code **)(*plVar1 + 0x58))(plVar1,3);
    if (pQVar2 != (QFont *)0x0) {
      local_40.d = (Data *)0x0;
      local_58.d = (Data *)0x0;
      local_58.ptr = (char *)0x0;
      local_40.ptr = "QMenuItem";
      local_58.size = 0;
      local_40.size = 9;
      QHash<QByteArray,QFont>::emplace<QFont_const&>(this_00,(QByteArray *)&local_40,pQVar2);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_40);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_58);
    }
    pQVar2 = (QFont *)(**(code **)(*plVar1 + 0x58))(plVar1,4);
    if (pQVar2 != (QFont *)0x0) {
      local_40.d = (Data *)0x0;
      local_58.d = (Data *)0x0;
      local_58.ptr = (char *)0x0;
      local_40.ptr = "QMessageBox";
      local_58.size = 0;
      local_40.size = 0xb;
      QHash<QByteArray,QFont>::emplace<QFont_const&>(this_00,(QByteArray *)&local_40,pQVar2);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_40);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_58);
    }
    pQVar2 = (QFont *)(**(code **)(*plVar1 + 0x58))(plVar1,5);
    if (pQVar2 != (QFont *)0x0) {
      local_40.d = (Data *)0x0;
      local_58.d = (Data *)0x0;
      local_58.ptr = (char *)0x0;
      local_40.ptr = "QLabel";
      local_58.size = 0;
      local_40.size = 6;
      QHash<QByteArray,QFont>::emplace<QFont_const&>(this_00,(QByteArray *)&local_40,pQVar2);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_40);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_58);
    }
    pQVar2 = (QFont *)(**(code **)(*plVar1 + 0x58))(plVar1,6);
    if (pQVar2 != (QFont *)0x0) {
      local_40.d = (Data *)0x0;
      local_58.d = (Data *)0x0;
      local_58.ptr = (char *)0x0;
      local_40.ptr = "QTipLabel";
      local_58.size = 0;
      local_40.size = 9;
      QHash<QByteArray,QFont>::emplace<QFont_const&>(this_00,(QByteArray *)&local_40,pQVar2);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_40);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_58);
    }
    pQVar2 = (QFont *)(**(code **)(*plVar1 + 0x58))(plVar1,8);
    if (pQVar2 != (QFont *)0x0) {
      local_40.d = (Data *)0x0;
      local_58.d = (Data *)0x0;
      local_58.ptr = (char *)0x0;
      local_40.ptr = "QTitleBar";
      local_58.size = 0;
      local_40.size = 9;
      QHash<QByteArray,QFont>::emplace<QFont_const&>(this_00,(QByteArray *)&local_40,pQVar2);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_40);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_58);
    }
    pQVar2 = (QFont *)(**(code **)(*plVar1 + 0x58))(plVar1,7);
    if (pQVar2 != (QFont *)0x0) {
      local_40.d = (Data *)0x0;
      local_58.d = (Data *)0x0;
      local_58.ptr = (char *)0x0;
      local_40.ptr = "QStatusBar";
      local_58.size = 0;
      local_40.size = 10;
      QHash<QByteArray,QFont>::emplace<QFont_const&>(this_00,(QByteArray *)&local_40,pQVar2);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_40);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_58);
    }
    pQVar2 = (QFont *)(**(code **)(*plVar1 + 0x58))(plVar1,9);
    if (pQVar2 != (QFont *)0x0) {
      local_40.d = (Data *)0x0;
      local_58.d = (Data *)0x0;
      local_58.ptr = (char *)0x0;
      local_40.ptr = "QMdiSubWindowTitleBar";
      local_58.size = 0;
      local_40.size = 0x15;
      QHash<QByteArray,QFont>::emplace<QFont_const&>(this_00,(QByteArray *)&local_40,pQVar2);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_40);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_58);
    }
    pQVar2 = (QFont *)(**(code **)(*plVar1 + 0x58))(plVar1,10);
    if (pQVar2 != (QFont *)0x0) {
      local_40.d = (Data *)0x0;
      local_58.d = (Data *)0x0;
      local_58.ptr = (char *)0x0;
      local_40.ptr = "QDockWidgetTitle";
      local_58.size = 0;
      local_40.size = 0x10;
      QHash<QByteArray,QFont>::emplace<QFont_const&>(this_00,(QByteArray *)&local_40,pQVar2);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_40);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_58);
    }
    pQVar2 = (QFont *)(**(code **)(*plVar1 + 0x58))(plVar1,0xb);
    if (pQVar2 != (QFont *)0x0) {
      local_40.d = (Data *)0x0;
      local_58.d = (Data *)0x0;
      local_58.ptr = (char *)0x0;
      local_40.ptr = "QPushButton";
      local_58.size = 0;
      local_40.size = 0xb;
      QHash<QByteArray,QFont>::emplace<QFont_const&>(this_00,(QByteArray *)&local_40,pQVar2);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_40);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_58);
    }
    pQVar2 = (QFont *)(**(code **)(*plVar1 + 0x58))(plVar1,0xc);
    if (pQVar2 != (QFont *)0x0) {
      local_40.d = (Data *)0x0;
      local_58.d = (Data *)0x0;
      local_58.ptr = (char *)0x0;
      local_40.ptr = "QCheckBox";
      local_58.size = 0;
      local_40.size = 9;
      QHash<QByteArray,QFont>::emplace<QFont_const&>(this_00,(QByteArray *)&local_40,pQVar2);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_40);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_58);
    }
    pQVar2 = (QFont *)(**(code **)(*plVar1 + 0x58))(plVar1,0xd);
    if (pQVar2 != (QFont *)0x0) {
      local_40.d = (Data *)0x0;
      local_58.d = (Data *)0x0;
      local_58.ptr = (char *)0x0;
      local_40.ptr = "QRadioButton";
      local_58.size = 0;
      local_40.size = 0xc;
      QHash<QByteArray,QFont>::emplace<QFont_const&>(this_00,(QByteArray *)&local_40,pQVar2);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_40);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_58);
    }
    pQVar2 = (QFont *)(**(code **)(*plVar1 + 0x58))(plVar1,0xe);
    if (pQVar2 != (QFont *)0x0) {
      local_40.d = (Data *)0x0;
      local_58.d = (Data *)0x0;
      local_58.ptr = (char *)0x0;
      local_40.ptr = "QToolButton";
      local_58.size = 0;
      local_40.size = 0xb;
      QHash<QByteArray,QFont>::emplace<QFont_const&>(this_00,(QByteArray *)&local_40,pQVar2);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_40);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_58);
    }
    pQVar2 = (QFont *)(**(code **)(*plVar1 + 0x58))(plVar1,0xf);
    if (pQVar2 != (QFont *)0x0) {
      local_40.d = (Data *)0x0;
      local_58.d = (Data *)0x0;
      local_58.ptr = (char *)0x0;
      local_40.ptr = "QAbstractItemView";
      local_58.size = 0;
      local_40.size = 0x11;
      QHash<QByteArray,QFont>::emplace<QFont_const&>(this_00,(QByteArray *)&local_40,pQVar2);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_40);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_58);
    }
    pQVar2 = (QFont *)(**(code **)(*plVar1 + 0x58))(plVar1,0x10);
    if (pQVar2 != (QFont *)0x0) {
      local_40.d = (Data *)0x0;
      local_58.d = (Data *)0x0;
      local_58.ptr = (char *)0x0;
      local_40.ptr = "QListView";
      local_58.size = 0;
      local_40.size = 9;
      QHash<QByteArray,QFont>::emplace<QFont_const&>(this_00,(QByteArray *)&local_40,pQVar2);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_40);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_58);
    }
    pQVar2 = (QFont *)(**(code **)(*plVar1 + 0x58))(plVar1,0x11);
    if (pQVar2 != (QFont *)0x0) {
      local_40.d = (Data *)0x0;
      local_58.d = (Data *)0x0;
      local_58.ptr = (char *)0x0;
      local_40.ptr = "QHeaderView";
      local_58.size = 0;
      local_40.size = 0xb;
      QHash<QByteArray,QFont>::emplace<QFont_const&>(this_00,(QByteArray *)&local_40,pQVar2);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_40);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_58);
    }
    pQVar2 = (QFont *)(**(code **)(*plVar1 + 0x58))(plVar1,0x12);
    if (pQVar2 != (QFont *)0x0) {
      local_40.d = (Data *)0x0;
      local_58.d = (Data *)0x0;
      local_58.ptr = (char *)0x0;
      local_40.ptr = "QListBox";
      local_58.size = 0;
      local_40.size = 8;
      QHash<QByteArray,QFont>::emplace<QFont_const&>(this_00,(QByteArray *)&local_40,pQVar2);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_40);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_58);
    }
    pQVar2 = (QFont *)(**(code **)(*plVar1 + 0x58))(plVar1,0x13);
    if (pQVar2 != (QFont *)0x0) {
      local_40.d = (Data *)0x0;
      local_58.d = (Data *)0x0;
      local_58.ptr = (char *)0x0;
      local_40.ptr = "QComboMenuItem";
      local_58.size = 0;
      local_40.size = 0xe;
      QHash<QByteArray,QFont>::emplace<QFont_const&>(this_00,(QByteArray *)&local_40,pQVar2);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_40);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_58);
    }
    pQVar2 = (QFont *)(**(code **)(*plVar1 + 0x58))(plVar1,0x14);
    if (pQVar2 != (QFont *)0x0) {
      local_40.d = (Data *)0x0;
      local_58.d = (Data *)0x0;
      local_58.ptr = (char *)0x0;
      local_40.ptr = "QComboLineEdit";
      local_58.size = 0;
      local_40.size = 0xe;
      QHash<QByteArray,QFont>::emplace<QFont_const&>(this_00,(QByteArray *)&local_40,pQVar2);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_40);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_58);
    }
    pQVar2 = (QFont *)(**(code **)(*plVar1 + 0x58))(plVar1,0x15);
    if (pQVar2 != (QFont *)0x0) {
      local_40.d = (Data *)0x0;
      local_58.d = (Data *)0x0;
      local_58.ptr = (char *)0x0;
      local_40.ptr = "QSmallFont";
      local_58.size = 0;
      local_40.size = 10;
      QHash<QByteArray,QFont>::emplace<QFont_const&>(this_00,(QByteArray *)&local_40,pQVar2);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_40);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_58);
    }
    pQVar2 = (QFont *)(**(code **)(*plVar1 + 0x58))(plVar1,0x16);
    if (pQVar2 != (QFont *)0x0) {
      local_40.d = (Data *)0x0;
      local_58.d = (Data *)0x0;
      local_58.ptr = (char *)0x0;
      local_40.ptr = "QMiniFont";
      local_58.size = 0;
      local_40.size = 9;
      QHash<QByteArray,QFont>::emplace<QFont_const&>(this_00,(QByteArray *)&local_40,pQVar2);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_40);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_58);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QApplicationPrivate::initializeWidgetFontHash()
{
    const QPlatformTheme *theme = QGuiApplicationPrivate::platformTheme();
    if (!theme)
        return;
    FontHash *fontHash = app_fonts();
    fontHash->clear();

    if (const QFont *font = theme->font(QPlatformTheme::MenuFont))
        fontHash->insert(QByteArrayLiteral("QMenu"), *font);
    if (const QFont *font = theme->font(QPlatformTheme::MenuBarFont))
        fontHash->insert(QByteArrayLiteral("QMenuBar"), *font);
    if (const QFont *font = theme->font(QPlatformTheme::MenuItemFont))
        fontHash->insert(QByteArrayLiteral("QMenuItem"), *font);
    if (const QFont *font = theme->font(QPlatformTheme::MessageBoxFont))
        fontHash->insert(QByteArrayLiteral("QMessageBox"), *font);
    if (const QFont *font = theme->font(QPlatformTheme::LabelFont))
        fontHash->insert(QByteArrayLiteral("QLabel"), *font);
    if (const QFont *font = theme->font(QPlatformTheme::TipLabelFont))
        fontHash->insert(QByteArrayLiteral("QTipLabel"), *font);
    if (const QFont *font = theme->font(QPlatformTheme::TitleBarFont))
        fontHash->insert(QByteArrayLiteral("QTitleBar"), *font);
    if (const QFont *font = theme->font(QPlatformTheme::StatusBarFont))
        fontHash->insert(QByteArrayLiteral("QStatusBar"), *font);
    if (const QFont *font = theme->font(QPlatformTheme::MdiSubWindowTitleFont))
        fontHash->insert(QByteArrayLiteral("QMdiSubWindowTitleBar"), *font);
    if (const QFont *font = theme->font(QPlatformTheme::DockWidgetTitleFont))
        fontHash->insert(QByteArrayLiteral("QDockWidgetTitle"), *font);
    if (const QFont *font = theme->font(QPlatformTheme::PushButtonFont))
        fontHash->insert(QByteArrayLiteral("QPushButton"), *font);
    if (const QFont *font = theme->font(QPlatformTheme::CheckBoxFont))
        fontHash->insert(QByteArrayLiteral("QCheckBox"), *font);
    if (const QFont *font = theme->font(QPlatformTheme::RadioButtonFont))
        fontHash->insert(QByteArrayLiteral("QRadioButton"), *font);
    if (const QFont *font = theme->font(QPlatformTheme::ToolButtonFont))
        fontHash->insert(QByteArrayLiteral("QToolButton"), *font);
    if (const QFont *font = theme->font(QPlatformTheme::ItemViewFont))
        fontHash->insert(QByteArrayLiteral("QAbstractItemView"), *font);
    if (const QFont *font = theme->font(QPlatformTheme::ListViewFont))
        fontHash->insert(QByteArrayLiteral("QListView"), *font);
    if (const QFont *font = theme->font(QPlatformTheme::HeaderViewFont))
        fontHash->insert(QByteArrayLiteral("QHeaderView"), *font);
    if (const QFont *font = theme->font(QPlatformTheme::ListBoxFont))
        fontHash->insert(QByteArrayLiteral("QListBox"), *font);
    if (const QFont *font = theme->font(QPlatformTheme::ComboMenuItemFont))
        fontHash->insert(QByteArrayLiteral("QComboMenuItem"), *font);
    if (const QFont *font = theme->font(QPlatformTheme::ComboLineEditFont))
        fontHash->insert(QByteArrayLiteral("QComboLineEdit"), *font);
    if (const QFont *font = theme->font(QPlatformTheme::SmallFont))
        fontHash->insert(QByteArrayLiteral("QSmallFont"), *font);
    if (const QFont *font = theme->font(QPlatformTheme::MiniFont))
        fontHash->insert(QByteArrayLiteral("QMiniFont"), *font);
}